

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

int ON_ComparePointList(int dim,bool is_rat,int point_count,int point_strideA,double *pointA,
                       int point_strideB,double *pointB)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double B [3];
  double A [3];
  double local_68 [4];
  double local_48 [3];
  
  bVar3 = true;
  if (((((0 < point_count && dim < 4) && is_rat) && (bVar4 = ON_IsValid(pointA[dim]), bVar4)) &&
      ((pointA[dim] != 0.0 || (NAN(pointA[dim]))))) && (bVar4 = ON_IsValid(pointB[dim]), bVar4)) {
    bVar3 = pointB[dim] == 0.0;
  }
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  iVar5 = 0;
  local_48[2] = 0.0;
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  if (0 < point_count) {
    iVar7 = 0;
    iVar9 = 0;
    do {
      iVar5 = ON_ComparePoint(dim,is_rat,pointA,pointB);
      if (iVar5 != 0 && !bVar3) {
        dVar1 = pointA[dim];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar2 = pointB[dim];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            if (iVar7 == 0) {
              iVar7 = iVar5;
            }
            if (0 < dim) {
              uVar6 = 0;
              do {
                local_48[uVar6] = pointA[uVar6] / dVar1;
                local_68[uVar6] = pointB[uVar6] / dVar2;
                uVar6 = uVar6 + 1;
              } while ((uint)dim != uVar6);
            }
            iVar5 = 0;
            if (0 < dim) {
              lVar8 = 0;
              do {
                dVar1 = local_48[lVar8];
                dVar2 = local_68[lVar8];
                dVar11 = (ABS(dVar2) + ABS(dVar1)) * 2.2737367544323206e-13;
                dVar10 = 2.3283064365386963e-10;
                if (2.3283064365386963e-10 <= dVar11) {
                  dVar10 = dVar11;
                }
                iVar5 = iVar7;
              } while (((dVar2 - dVar10 <= dVar1) && (dVar1 - dVar10 <= dVar2)) &&
                      (lVar8 = lVar8 + 1, iVar5 = 0, dim != (int)lVar8));
            }
          }
        }
      }
      iVar9 = iVar9 + 1;
      if (point_count <= iVar9) {
        return iVar5;
      }
      pointA = pointA + point_strideA;
      pointB = pointB + point_strideB;
    } while (iVar5 == 0);
  }
  return iVar5;
}

Assistant:

int 
ON_ComparePointList( // returns 
                              // -1: first < second
                              //  0: first == second
                              // +1: first > second
          int dim,
          bool is_rat,
          int point_count,
          int point_strideA,
          const double* pointA,
          int point_strideB,
          const double* pointB
          )
{
  int i, rc = 0, rc1 = 0;
  const bool bDoSecondCheck = ( 1 == is_rat && dim <= 3 && point_count > 0 
                         && ON_IsValid(pointA[dim]) && 0.0 != pointA[dim]
                         && ON_IsValid(pointB[dim]) && 0.0 != pointB[dim]
                         );
  double A[3] = {0.0,0.0,0.0};
  double B[3] = {0.0,0.0,0.0};
  //const size_t AB_size = dim*sizeof(A[0]);

  for ( i = 0; i < point_count && !rc; i++ ) 
  {
    rc = ON_ComparePoint( dim, is_rat, pointA, pointB );
    if (    rc && bDoSecondCheck 
      && 0.0 != pointA[dim] && 0.0 != pointB[dim]
      )
    {
      if ( !rc1 )
        rc1 = rc;
      // bDoSecondCheck = true ensures is_rat is true and pointX[dim] != 0.0
      for(int k = 0; k < dim; k++) 
      {
        A[k] = pointA[k]/pointA[dim];      
        B[k] = pointB[k]/pointB[dim];
      }
      rc = ( 0 == ON_ComparePoint( dim, 0, A, B ) ) ? 0 : rc1;
    }
    pointA += point_strideA;
    pointB += point_strideB;
  }

  return rc;
}